

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O1

void MD5Update(MD5Context *ctx,uchar *buf,uint len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar10 = ctx->bits[0];
  ctx->bits[0] = len * 8 + uVar10;
  if (CARRY4(len * 8,uVar10)) {
    ctx->bits[1] = ctx->bits[1] + 1;
  }
  ctx->bits[1] = ctx->bits[1] + (len >> 0x1d);
  uVar8 = uVar10 >> 3 & 0x3f;
  uVar10 = len;
  if (uVar8 != 0) {
    uVar9 = 0x40 - uVar8;
    uVar10 = len - uVar9;
    if (len < uVar9) {
      memcpy(ctx->in + uVar8,buf,(ulong)len);
      return;
    }
    memcpy(ctx->in + uVar8,buf,(ulong)uVar9);
    MD5Transform(ctx->buf,(uint32 *)ctx->in);
    buf = buf + uVar9;
  }
  if (0x3f < uVar10) {
    do {
      uVar1 = *(undefined8 *)buf;
      uVar2 = *(undefined8 *)(buf + 8);
      uVar3 = *(undefined8 *)(buf + 0x10);
      uVar4 = *(undefined8 *)(buf + 0x18);
      uVar5 = *(undefined8 *)(buf + 0x20);
      uVar6 = *(undefined8 *)(buf + 0x28);
      uVar7 = *(undefined8 *)(buf + 0x38);
      *(undefined8 *)(ctx->in + 0x30) = *(undefined8 *)(buf + 0x30);
      *(undefined8 *)(ctx->in + 0x38) = uVar7;
      *(undefined8 *)(ctx->in + 0x20) = uVar5;
      *(undefined8 *)(ctx->in + 0x28) = uVar6;
      *(undefined8 *)(ctx->in + 0x10) = uVar3;
      *(undefined8 *)(ctx->in + 0x18) = uVar4;
      *(undefined8 *)ctx->in = uVar1;
      *(undefined8 *)(ctx->in + 8) = uVar2;
      MD5Transform(ctx->buf,(uint32 *)ctx->in);
      buf = buf + 0x40;
      uVar10 = uVar10 - 0x40;
    } while (0x3f < uVar10);
  }
  memcpy(ctx->in,buf,(ulong)uVar10);
  return;
}

Assistant:

void MD5Update(struct MD5Context *ctx, unsigned char *buf, unsigned int len)
{
  uint32 t;

  /* Update bitcount */

  t = ctx->bits[0];
  if ((ctx->bits[0] = t + ((uint32)len << 3)) < t)
    ctx->bits[1]++;             /* Carry from low to high */
  ctx->bits[1] += len >> 29;

  t = (t >> 3) & 0x3f;          /* Bytes already in shsInfo->data */

  /* Handle any leading odd-sized chunks */

  if (t) {
    unsigned char *p = (unsigned char *)ctx->in + t;

    t = 64 - t;
    if (len < t) {
      memcpy(p, buf, len);
      return;
    }
    memcpy(p, buf, t);
    byteReverse(ctx->in, 16);
    MD5Transform(ctx->buf, (uint32 *)ctx->in);
    buf += t;
    len -= t;
  }
  /* Process data in 64-byte chunks */

  while (len >= 64) {
    memcpy(ctx->in, buf, 64);
    byteReverse(ctx->in, 16);
    MD5Transform(ctx->buf, (uint32 *)ctx->in);
    buf += 64;
    len -= 64;
  }

  /* Handle any remaining bytes of data. */

  memcpy(ctx->in, buf, len);
}